

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node_instance.c
# Opt level: O0

apx_error_t
apx_nodeInstance_attach_to_file_manager(apx_nodeInstance_t *self,apx_fileManager_tag *file_manager)

{
  apx_fileManager_tag *file_manager_local;
  apx_nodeInstance_t *self_local;
  
  if (self == (apx_nodeInstance_t *)0x0) {
    self_local._4_4_ = 1;
  }
  else if (self->mode == '\x01') {
    self_local._4_4_ = apx_nodeInstance_attach_to_file_manager_client_mode(self,file_manager);
  }
  else {
    self_local._4_4_ = apx_nodeInstance_attach_to_file_manager_server_mode(self,file_manager);
  }
  return self_local._4_4_;
}

Assistant:

apx_error_t apx_nodeInstance_attach_to_file_manager(apx_nodeInstance_t* self, struct apx_fileManager_tag* file_manager)
{
   if (self != NULL)
   {
      if (self->mode == APX_CLIENT_MODE)
      {
         return apx_nodeInstance_attach_to_file_manager_client_mode(self, file_manager);
      }
      else
      {
         return apx_nodeInstance_attach_to_file_manager_server_mode(self, file_manager);
      }
   }
   return APX_INVALID_ARGUMENT_ERROR;
}